

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_drl_idx(FRAME_CONTEXT *ec_ctx,MB_MODE_INFO *mbmi,MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame,
                  aom_writer *w)

{
  uint8_t uVar1;
  uint symb;
  int iVar2;
  aom_writer *in_RCX;
  long in_RDX;
  long in_RSI;
  uint8_t drl_ctx_1;
  int idx_1;
  uint8_t drl_ctx;
  int idx;
  int new_mv;
  undefined3 uVar3;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint local_28;
  int nsymbs;
  
  uVar3 = CONCAT12(1,(short)in_stack_ffffffffffffffcc);
  if (*(char *)(in_RSI + 2) != '\x10') {
    uVar3 = CONCAT12(*(char *)(in_RSI + 2) == '\x18',(short)in_stack_ffffffffffffffcc);
  }
  nsymbs = CONCAT13((char)((uint)in_stack_ffffffffffffffcc >> 0x18),uVar3);
  symb = (uint)(byte)((uint3)uVar3 >> 0x10);
  if (symb == 0) {
    iVar2 = have_nearmv_in_inter_mode(*(PREDICTION_MODE *)(in_RSI + 2));
    if (iVar2 != 0) {
      for (iVar2 = 1; iVar2 < 3; iVar2 = iVar2 + 1) {
        if (iVar2 + 1 < (int)(uint)*(byte *)(in_RDX + 0x28)) {
          uVar1 = av1_drl_ctx((uint16_t *)(in_RDX + 0x20),iVar2);
          nsymbs = CONCAT13(uVar1,(int3)nsymbs);
          aom_write_symbol(in_RCX,symb,(aom_cdf_prob *)CONCAT44(in_stack_ffffffffffffffd4,iVar2),
                           nsymbs);
          if ((uint)((byte)(*(ushort *)(in_RSI + 0xa7) >> 4) & 3) == iVar2 - 1U) {
            return;
          }
        }
      }
    }
  }
  else {
    for (local_28 = 0; (int)local_28 < 2; local_28 = local_28 + 1) {
      if ((int)(local_28 + 1) < (int)(uint)*(byte *)(in_RDX + 0x28)) {
        uVar1 = av1_drl_ctx((uint16_t *)(in_RDX + 0x20),local_28);
        in_stack_ffffffffffffffd4 = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffd4);
        aom_write_symbol(in_RCX,symb,
                         (aom_cdf_prob *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),nsymbs);
        if (((byte)(*(ushort *)(in_RSI + 0xa7) >> 4) & 3) == local_28) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void write_drl_idx(FRAME_CONTEXT *ec_ctx,
                                 const MB_MODE_INFO *mbmi,
                                 const MB_MODE_INFO_EXT_FRAME *mbmi_ext_frame,
                                 aom_writer *w) {
  assert(mbmi->ref_mv_idx < 3);

  const int new_mv = mbmi->mode == NEWMV || mbmi->mode == NEW_NEWMV;
  if (new_mv) {
    int idx;
    for (idx = 0; idx < 2; ++idx) {
      if (mbmi_ext_frame->ref_mv_count > idx + 1) {
        uint8_t drl_ctx = av1_drl_ctx(mbmi_ext_frame->weight, idx);

        aom_write_symbol(w, mbmi->ref_mv_idx != idx, ec_ctx->drl_cdf[drl_ctx],
                         2);
        if (mbmi->ref_mv_idx == idx) return;
      }
    }
    return;
  }

  if (have_nearmv_in_inter_mode(mbmi->mode)) {
    int idx;
    // TODO(jingning): Temporary solution to compensate the NEARESTMV offset.
    for (idx = 1; idx < 3; ++idx) {
      if (mbmi_ext_frame->ref_mv_count > idx + 1) {
        uint8_t drl_ctx = av1_drl_ctx(mbmi_ext_frame->weight, idx);
        aom_write_symbol(w, mbmi->ref_mv_idx != (idx - 1),
                         ec_ctx->drl_cdf[drl_ctx], 2);
        if (mbmi->ref_mv_idx == (idx - 1)) return;
      }
    }
    return;
  }
}